

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_display.cpp
# Opt level: O2

bool __thiscall cppurses::Text_display::paint_event(Text_display *this)

{
  pointer pLVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  __normal_iterator<cppurses::Glyph_*,_std::vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>_>
  first;
  pointer pLVar6;
  Painter p;
  pointer local_80;
  vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_> local_70;
  Painter local_58;
  
  Painter::Painter(&local_58,&this->super_Widget);
  sVar4 = this->top_line_;
  pLVar1 = (this->display_state_).
           super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_80 = (this->display_state_).
             super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  pLVar6 = pLVar1 + sVar4;
  sVar3 = Widget::height(&this->super_Widget);
  if (sVar3 + sVar4 < (ulong)((long)local_80 - (long)pLVar1 >> 4)) {
    sVar4 = Widget::height(&this->super_Widget);
    local_80 = pLVar6 + sVar4;
  }
  if (this->top_line_ <
      (ulong)((long)(this->display_state_).
                    super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->display_state_).
                    super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4)) {
    sVar4 = 0;
    for (; pLVar6 != local_80; pLVar6 = pLVar6 + 1) {
      first._M_current =
           (this->contents_).super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>.
           super__Vector_base<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>._M_impl.
           super__Vector_impl_data._M_start + pLVar6->start_index;
      sVar3 = pLVar6->length;
      if (this->alignment_ == Right) {
        sVar5 = Widget::width(&this->super_Widget);
        sVar5 = sVar5 - pLVar6->length;
      }
      else if (this->alignment_ == Center) {
        sVar5 = Widget::width(&this->super_Widget);
        sVar5 = sVar5 - pLVar6->length >> 1;
      }
      else {
        sVar5 = 0;
      }
      Glyph_string::
      Glyph_string<__gnu_cxx::__normal_iterator<cppurses::Glyph*,std::vector<cppurses::Glyph,std::allocator<cppurses::Glyph>>>>
                ((Glyph_string *)&local_70,first,first._M_current + sVar3);
      Painter::put(&local_58,(Glyph_string *)&local_70,sVar5,sVar4);
      sVar4 = sVar4 + 1;
      std::vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>::~vector(&local_70);
    }
  }
  bVar2 = Widget::paint_event(&this->super_Widget);
  return bVar2;
}

Assistant:

bool Text_display::paint_event() {
    Painter p{*this};
    std::size_t line_n{0};
    auto paint = [&p, &line_n, this](const Line_info& line) {
        auto sub_begin = std::begin(this->contents_) + line.start_index;
        auto sub_end = sub_begin + line.length;
        std::size_t start{0};
        switch (alignment_) {
            case Alignment::Left:
                start = 0;
                break;
            case Alignment::Center:
                start = (this->width() - line.length) / 2;
                break;
            case Alignment::Right:
                start = this->width() - line.length;
                break;
        }
        p.put(Glyph_string(sub_begin, sub_end), start, line_n++);
    };
    auto begin = std::begin(display_state_) + this->top_line();
    auto end = std::end(display_state_);
    if (display_state_.size() > this->top_line() + this->height()) {
        end = begin + this->height();  // maybe make this the initial value?
    }
    if (this->top_line() < display_state_.size()) {
        std::for_each(begin, end, paint);
    }
    return Widget::paint_event();
}